

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O1

int print_hex(BIO *bp,uint8_t *data,size_t len,int off)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (len == uVar5) goto LAB_0048cc2d;
    if ((uVar5 / 0xf) * 0xf == uVar5) {
      iVar2 = BIO_puts((BIO *)bp,"\n");
      if (iVar2 < 1) break;
      iVar2 = BIO_indent((BIO *)bp,off + 4,0x80);
      if (iVar2 == 0) break;
    }
    pcVar4 = ":";
    if (len - 1 == uVar5) {
      pcVar4 = "";
    }
    iVar2 = BIO_printf((BIO *)bp,"%02x%s",(ulong)data[uVar5],pcVar4);
    uVar1 = uVar5 + 1;
  } while (0 < iVar2);
  uVar3 = 0;
  if (len <= uVar5) {
LAB_0048cc2d:
    iVar2 = BIO_write((BIO *)bp,"\n",1);
    uVar3 = (uint)(0 < iVar2);
  }
  return uVar3;
}

Assistant:

static int print_hex(BIO *bp, const uint8_t *data, size_t len, int off) {
  for (size_t i = 0; i < len; i++) {
    if ((i % 15) == 0) {
      if (BIO_puts(bp, "\n") <= 0 ||  //
          !BIO_indent(bp, off + 4, 128)) {
        return 0;
      }
    }
    if (BIO_printf(bp, "%02x%s", data[i], (i + 1 == len) ? "" : ":") <= 0) {
      return 0;
    }
  }
  if (BIO_write(bp, "\n", 1) <= 0) {
    return 0;
  }
  return 1;
}